

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O2

void __thiscall SetWriter_read_Test::~SetWriter_read_Test(SetWriter_read_Test *this)

{
  anon_unknown.dwarf_28a10::SetWriter::~SetWriter(&this->super_SetWriter);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (SetWriter, read) {
    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    auto actual = pstore::serialize::read<std::set<int>> (archive);
    static_assert (std::is_same<decltype (actual), std::set<int>>::value,
                   "expected return type of serialize::read<std::set<int>> to be std::set<int>");
    EXPECT_EQ (set_, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}